

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderBasicData.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::Mode5TransponderBasicData::Encode
          (Mode5TransponderBasicData *this,KDataStream *stream)

{
  (*(this->m_Status).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Status);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16PIN);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32MsgFormats);
  (*(this->m_EM1Code).super_ModeXCodeRecord.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EM1Code,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16NationalOrigin);
  (*(this->m_SupplementalData).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_SupplementalData,stream);
  KDataStream::Write(stream,this->m_ui8NavSrc);
  KDataStream::Write(stream,this->m_ui8FigMerit);
  KDataStream::Write(stream,this->m_ui8Padding);
  return;
}

Assistant:

void Mode5TransponderBasicData::Encode( KDataStream & stream ) const
{
    stream << KDIS_STREAM m_Status
           << m_ui16PIN
           << m_ui32MsgFormats
           << KDIS_STREAM m_EM1Code
           << m_ui16NationalOrigin
           << KDIS_STREAM m_SupplementalData
           << m_ui8NavSrc
           << m_ui8FigMerit
           << m_ui8Padding;

}